

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

void __thiscall
cmMakefile::MaybeWarnUninitialized(cmMakefile *this,string *variable,char *sourceFilename)

{
  bool bVar1;
  ostream *poVar2;
  ostringstream msg;
  string local_1b0;
  undefined1 local_190 [376];
  
  if ((this->GlobalGenerator->CMakeInstance->WarnUninitialized == true) &&
     (bVar1 = cmStateSnapshot::IsInitialized(&this->StateSnapshot,variable), !bVar1)) {
    if (this->CheckSystemVars == false) {
      if (sourceFilename == (char *)0x0) {
        return;
      }
      bVar1 = IsProjectFile(this,sourceFilename);
      if (!bVar1) {
        return;
      }
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"uninitialized variable \'",0x18);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_190,(variable->_M_dataplus)._M_p,variable->_M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\'",1);
    std::__cxx11::stringbuf::str();
    cmake::IssueMessage(this->GlobalGenerator->CMakeInstance,AUTHOR_WARNING,&local_1b0,
                        &this->Backtrace);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
    std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  }
  return;
}

Assistant:

cmake* cmMakefile::GetCMakeInstance() const
{
  return this->GlobalGenerator->GetCMakeInstance();
}